

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvlTree.h
# Opt level: O0

shared_ptr<AvlTree<int>::Node> __thiscall
AvlTree<int>::_insert(AvlTree<int> *this,shared_ptr<AvlTree<int>::Node> *node,int *key)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  int *piVar5;
  int *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<AvlTree<int>::Node> sVar7;
  AvlTree<int> local_d8;
  AvlTree<int> local_c8;
  shared_ptr<const_AvlTree<int>::Node> local_b8;
  int local_a4;
  undefined1 local_a0 [4];
  int balance;
  shared_ptr<const_AvlTree<int>::Node> local_90;
  shared_ptr<const_AvlTree<int>::Node> local_80;
  int local_70 [4];
  shared_ptr<const_AvlTree<int>::Node> local_60;
  int local_4c;
  AvlTree<int> local_48;
  AvlTree<int> local_38;
  int *local_28;
  int *key_local;
  shared_ptr<AvlTree<int>::Node> *node_local;
  AvlTree<int> *this_local;
  
  local_28 = in_RCX;
  key_local = key;
  node_local = node;
  this_local = this;
  bVar1 = std::operator==((shared_ptr<AvlTree<int>::Node> *)key,(nullptr_t)0x0);
  if (bVar1) {
    sVar7 = Node::make_node((int *)this);
    _Var6 = sVar7.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  }
  else {
    iVar2 = *local_28;
    peVar4 = std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)key_local);
    if (peVar4->key <= iVar2) {
      peVar4 = std::
               __shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)key_local);
      if (*local_28 <= peVar4->key) {
        std::shared_ptr<AvlTree<int>::Node>::shared_ptr
                  (&this->m_Root,(shared_ptr<AvlTree<int>::Node> *)key_local);
        _Var6._M_pi = extraout_RDX;
        goto LAB_00103d5c;
      }
    }
    iVar2 = *local_28;
    peVar4 = std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)key_local);
    if (iVar2 < peVar4->key) {
      peVar4 = std::
               __shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)key_local);
      _insert(&local_38,node,(int *)&peVar4->left);
      peVar4 = std::
               __shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)key_local);
      std::shared_ptr<AvlTree<int>::Node>::operator=(&peVar4->left,&local_38.m_Root);
      std::shared_ptr<AvlTree<int>::Node>::~shared_ptr(&local_38.m_Root);
    }
    else {
      peVar4 = std::
               __shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)key_local);
      _insert(&local_48,node,(int *)&peVar4->right);
      peVar4 = std::
               __shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)key_local);
      std::shared_ptr<AvlTree<int>::Node>::operator=(&peVar4->right,&local_48.m_Root);
      std::shared_ptr<AvlTree<int>::Node>::~shared_ptr(&local_48.m_Root);
    }
    peVar4 = std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)key_local);
    std::shared_ptr<AvlTree<int>::Node_const>::shared_ptr<AvlTree<int>::Node,void>
              ((shared_ptr<AvlTree<int>::Node_const> *)&local_60,&peVar4->left);
    local_4c = _height((AvlTree<int> *)node,&local_60);
    peVar4 = std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)key_local);
    std::shared_ptr<AvlTree<int>::Node_const>::shared_ptr<AvlTree<int>::Node,void>
              ((shared_ptr<AvlTree<int>::Node_const> *)&local_80,&peVar4->right);
    local_70[0] = _height((AvlTree<int> *)node,&local_80);
    piVar5 = std::max<int>(&local_4c,local_70);
    iVar2 = *piVar5;
    peVar4 = std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)key_local);
    peVar4->height = iVar2 + 1;
    std::shared_ptr<const_AvlTree<int>::Node>::~shared_ptr(&local_80);
    std::shared_ptr<const_AvlTree<int>::Node>::~shared_ptr(&local_60);
    peVar4 = std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)key_local);
    std::shared_ptr<AvlTree<int>::Node_const>::shared_ptr<AvlTree<int>::Node,void>
              ((shared_ptr<AvlTree<int>::Node_const> *)&local_90,&peVar4->left);
    iVar2 = _size((AvlTree<int> *)node,&local_90);
    peVar4 = std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)key_local);
    std::shared_ptr<AvlTree<int>::Node_const>::shared_ptr<AvlTree<int>::Node,void>
              ((shared_ptr<AvlTree<int>::Node_const> *)local_a0,&peVar4->right);
    iVar3 = _size((AvlTree<int> *)node,(shared_ptr<const_AvlTree<int>::Node> *)local_a0);
    peVar4 = std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)key_local);
    peVar4->size = iVar2 + 1 + iVar3;
    std::shared_ptr<const_AvlTree<int>::Node>::~shared_ptr
              ((shared_ptr<const_AvlTree<int>::Node> *)local_a0);
    std::shared_ptr<const_AvlTree<int>::Node>::~shared_ptr(&local_90);
    std::shared_ptr<AvlTree<int>::Node_const>::shared_ptr<AvlTree<int>::Node,void>
              ((shared_ptr<AvlTree<int>::Node_const> *)&local_b8,
               (shared_ptr<AvlTree<int>::Node> *)key_local);
    iVar2 = _getBalance((AvlTree<int> *)node,&local_b8);
    std::shared_ptr<const_AvlTree<int>::Node>::~shared_ptr(&local_b8);
    local_a4 = iVar2;
    if (1 < iVar2) {
      iVar2 = *local_28;
      peVar4 = std::
               __shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)key_local);
      peVar4 = std::
               __shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar4->left);
      if (iVar2 < peVar4->key) {
        sVar7 = _rightRotate(this,node);
        _Var6 = sVar7.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi;
        goto LAB_00103d5c;
      }
    }
    if (local_a4 < -1) {
      peVar4 = std::
               __shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)key_local);
      peVar4 = std::
               __shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar4->right);
      if (peVar4->key < *local_28) {
        sVar7 = _leftRotate(this,node);
        _Var6 = sVar7.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi;
        goto LAB_00103d5c;
      }
    }
    if (1 < local_a4) {
      peVar4 = std::
               __shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)key_local);
      peVar4 = std::
               __shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar4->left);
      if (peVar4->key < *local_28) {
        std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)key_local);
        _leftRotate(&local_c8,node);
        peVar4 = std::
                 __shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)key_local);
        std::shared_ptr<AvlTree<int>::Node>::operator=(&peVar4->left,&local_c8.m_Root);
        std::shared_ptr<AvlTree<int>::Node>::~shared_ptr(&local_c8.m_Root);
        sVar7 = _rightRotate(this,node);
        _Var6 = sVar7.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi;
        goto LAB_00103d5c;
      }
    }
    if (local_a4 < -1) {
      iVar2 = *local_28;
      peVar4 = std::
               __shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)key_local);
      peVar4 = std::
               __shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar4->right);
      if (iVar2 < peVar4->key) {
        std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)key_local);
        _rightRotate(&local_d8,node);
        peVar4 = std::
                 __shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)key_local);
        std::shared_ptr<AvlTree<int>::Node>::operator=(&peVar4->right,&local_d8.m_Root);
        std::shared_ptr<AvlTree<int>::Node>::~shared_ptr(&local_d8.m_Root);
        sVar7 = _leftRotate(this,node);
        _Var6 = sVar7.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi;
        goto LAB_00103d5c;
      }
    }
    std::shared_ptr<AvlTree<int>::Node>::shared_ptr
              (&this->m_Root,(shared_ptr<AvlTree<int>::Node> *)key_local);
    _Var6._M_pi = extraout_RDX_00;
  }
LAB_00103d5c:
  sVar7.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar7.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<AvlTree<int>::Node>)
         sVar7.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Node> _insert(std::shared_ptr<Node>& node, T& key) {
        if(node == nullptr)
            return Node::make_node(key);

        if(!(key < node->key) && !(node->key < key)) // key == node->key
            return node;

        if(key < node->key)
            node->left = _insert(node->left, key);
        else
            node->right = _insert(node->right, key);

        node->height = std::max(_height(node->left), _height(node->right)) + 1;
        node->size = _size(node->left) + _size(node->right) + 1;

        int balance = _getBalance(node);

        // Left Left Case
        if (balance > 1 && key < node->left->key)
            return _rightRotate(node);

        // Right Right Case
        if (balance < -1 && node->right->key < key) // key > node->right->key
            return _leftRotate(node);

        // Left Right Case
        if (balance > 1 && node->left->key < key) // key > node->left->key
        {
            node->left = _leftRotate(node->left);
            return _rightRotate(node);
        }

        // Right Left Case
        if (balance < -1 && key < node->right->key)
        {
            node->right = _rightRotate(node->right);
            return _leftRotate(node);
        }

        // Return the (unchanged) node pointer
        return node;
    }